

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# advertise_service_options.h
# Opt level: O2

void __thiscall
miniros::AdvertiseServiceOptions::init<roscpp::GetLoggers>
          (AdvertiseServiceOptions *this,string *_service,
          function<bool_(roscpp::GetLoggersRequest_<std::allocator<void>_>_&,_roscpp::GetLoggersResponse_<std::allocator<void>_>_&)>
          *_callback)

{
  __shared_ptr<miniros::ServiceCallbackHelperT<miniros::ServiceSpec<roscpp::GetLoggersRequest_<std::allocator<void>_>,_roscpp::GetLoggersResponse_<std::allocator<void>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_28;
  
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::assign((char *)&this->md5sum);
  std::__cxx11::string::assign((char *)&this->datatype);
  std::__cxx11::string::assign((char *)&this->req_datatype);
  std::__cxx11::string::assign((char *)&this->res_datatype);
  std::
  make_shared<miniros::ServiceCallbackHelperT<miniros::ServiceSpec<roscpp::GetLoggersRequest_<std::allocator<void>>,roscpp::GetLoggersResponse_<std::allocator<void>>>>,std::function<bool(roscpp::GetLoggersRequest_<std::allocator<void>>&,roscpp::GetLoggersResponse_<std::allocator<void>>&)>const&>
            ((function<bool_(roscpp::GetLoggersRequest_<std::allocator<void>_>_&,_roscpp::GetLoggersResponse_<std::allocator<void>_>_&)>
              *)&_Stack_28);
  std::__shared_ptr<miniros::ServiceCallbackHelper,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<miniros::ServiceCallbackHelper,(__gnu_cxx::_Lock_policy)2> *)
             &this->helper,&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return;
}

Assistant:

void init(const std::string& _service, const std::function<bool(typename Service::Request&, typename Service::Response&)>& _callback)
  {
    namespace st = service_traits;
    namespace mt = message_traits;
    typedef typename Service::Request Request;
    typedef typename Service::Response Response;
    service = _service;
    md5sum = st::md5sum<Service>();
    datatype = st::datatype<Service>();
    req_datatype = mt::datatype<Request>();
    res_datatype = mt::datatype<Response>();
    helper = std::make_shared<ServiceCallbackHelperT<ServiceSpec<Request, Response> > >(_callback);
  }